

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appendable.cpp
# Opt level: O2

UBool __thiscall icu_63::Appendable::appendString(Appendable *this,UChar *s,int32_t length)

{
  UChar UVar1;
  UBool UVar2;
  int iVar3;
  UChar *pUVar4;
  bool bVar5;
  
  if (length < 0) {
    do {
      UVar1 = *s;
      if (UVar1 == L'\0') goto LAB_002c6324;
      s = s + 1;
      iVar3 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(ushort)UVar1);
    } while ((char)iVar3 != '\0');
LAB_002c6303:
    UVar2 = '\0';
  }
  else {
    if (length != 0) {
      pUVar4 = s + 1;
      do {
        iVar3 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(ushort)pUVar4[-1]);
        if ((char)iVar3 == '\0') break;
        bVar5 = pUVar4 < s + (uint)length;
        pUVar4 = pUVar4 + 1;
      } while (bVar5);
      if ((char)iVar3 == '\0') goto LAB_002c6303;
    }
LAB_002c6324:
    UVar2 = '\x01';
  }
  return UVar2;
}

Assistant:

UBool
Appendable::appendString(const UChar *s, int32_t length) {
    if(length<0) {
        UChar c;
        while((c=*s++)!=0) {
            if(!appendCodeUnit(c)) {
                return FALSE;
            }
        }
    } else if(length>0) {
        const UChar *limit=s+length;
        do {
            if(!appendCodeUnit(*s++)) {
                return FALSE;
            }
        } while(s<limit);
    }
    return TRUE;
}